

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slaveinfo.c
# Opt level: O3

void si_sdo(int cnt)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  memset(&ODlist,0,0xbc04);
  iVar1 = ec_readODlist(cnt & 0xffff,&ODlist);
  if (iVar1 == 0) {
    while (EcatError != '\0') {
      uVar2 = ec_elist2string();
      printf("%s",uVar2);
    }
  }
  else {
    printf(" CoE Object Description found, %d entries.\n",(ulong)ODlist.Entries);
    if (ODlist.Entries != 0) {
      uVar4 = 0;
      do {
        ec_readODdescription(uVar4 & 0xffff,&ODlist);
        while (EcatError != '\0') {
          uVar2 = ec_elist2string();
          printf("%s",uVar2);
        }
        printf(" Index: %4.4x Datatype: %4.4x Objectcode: %2.2x Name: %s\n",
               (ulong)ODlist.Index[uVar4],(ulong)ODlist.DataType[uVar4],
               (ulong)ODlist.ObjectCode[uVar4],uVar4 * 0x29 + 0x107d94);
        memset(&OElist,0,0x3002);
        ec_readOE(uVar4 & 0xffff,&ODlist,&OElist);
        while (EcatError != '\0') {
          uVar2 = ec_elist2string();
          printf("%s",uVar2);
        }
        lVar6 = 0x112896;
        uVar5 = 0;
        do {
          if (((OElist.DataType[uVar5] != 0) && (OElist.BitLength[uVar5] != 0)) &&
             (printf("  Sub: %2.2x Datatype: %4.4x Bitlength: %4.4x Obj.access: %4.4x Name: %s\n",
                     uVar5 & 0xffffffff,(ulong)OElist.DataType[uVar5],(ulong)OElist.BitLength[uVar5]
                     ,(ulong)OElist.ObjAccess[uVar5],lVar6), (OElist.ObjAccess[uVar5] & 7) != 0)) {
            pcVar3 = SDO2string((uint16)cnt,ODlist.Index[uVar4],(uint8)uVar5,OElist.DataType[uVar5])
            ;
            printf("          Value :%s\n",pcVar3);
          }
          lVar6 = lVar6 + 0x29;
          bVar7 = uVar5 < ODlist.MaxSub[uVar4];
          uVar5 = uVar5 + 1;
        } while (bVar7);
        uVar4 = uVar4 + 1;
      } while (uVar4 < ODlist.Entries);
    }
  }
  return;
}

Assistant:

void si_sdo(int cnt)
{
    int i, j;
    
    ODlist.Entries = 0;
    memset(&ODlist, 0, sizeof(ODlist));
    if( ec_readODlist(cnt, &ODlist))
    {
        printf(" CoE Object Description found, %d entries.\n",ODlist.Entries);
        for( i = 0 ; i < ODlist.Entries ; i++)
        {
            ec_readODdescription(i, &ODlist); 
            while(EcatError) printf("%s", ec_elist2string());
            printf(" Index: %4.4x Datatype: %4.4x Objectcode: %2.2x Name: %s\n",
                ODlist.Index[i], ODlist.DataType[i], ODlist.ObjectCode[i], ODlist.Name[i]);
            memset(&OElist, 0, sizeof(OElist));
            ec_readOE(i, &ODlist, &OElist);
            while(EcatError) printf("%s", ec_elist2string());
            for( j = 0 ; j < ODlist.MaxSub[i]+1 ; j++)
            {
                if ((OElist.DataType[j] > 0) && (OElist.BitLength[j] > 0))
                {
                    printf("  Sub: %2.2x Datatype: %4.4x Bitlength: %4.4x Obj.access: %4.4x Name: %s\n",
                        j, OElist.DataType[j], OElist.BitLength[j], OElist.ObjAccess[j], OElist.Name[j]);
                    if ((OElist.ObjAccess[j] & 0x0007))
                    {
                        printf("          Value :%s\n", SDO2string(cnt, ODlist.Index[i], j, OElist.DataType[j]));
                    }
                }
            }   
        }   
    }
    else
    {
        while(EcatError) printf("%s", ec_elist2string());
    }
}